

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O2

char * Kit_PlaFromIsop(Vec_Str_t *vStr,int nVars,Vec_Int_t *vCover)

{
  char Entry;
  int iVar1;
  byte bVar2;
  int iVar3;
  int i;
  bool bVar4;
  
  iVar3 = vCover->nSize;
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(vCover) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,0x171,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
  }
  vStr->nSize = 0;
  i = 0;
  if (nVars < 1) {
    nVars = i;
  }
  for (; i < iVar3; i = i + 1) {
    iVar1 = Vec_IntEntry(vCover,i);
    bVar2 = 0;
    iVar3 = nVars;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      switch(iVar1 >> (bVar2 & 0x1f) & 3) {
      case 0:
        Entry = '-';
        break;
      case 1:
        Entry = '0';
        break;
      case 2:
        Entry = '1';
        break;
      case 3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                      ,0x181,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
      }
      Vec_StrPush(vStr,Entry);
      bVar2 = bVar2 + 2;
    }
    Vec_StrPush(vStr,' ');
    Vec_StrPush(vStr,'1');
    Vec_StrPush(vStr,'\n');
    iVar3 = vCover->nSize;
  }
  Vec_StrPush(vStr,'\0');
  return vStr->pArray;
}

Assistant:

char * Kit_PlaFromIsop( Vec_Str_t * vStr, int nVars, Vec_Int_t * vCover )
{
    int i, k, Entry, Literal;
    assert( Vec_IntSize(vCover) > 0 );
    if ( Vec_IntSize(vCover) == 0 )
        return NULL;
    Vec_StrClear( vStr );
    Vec_IntForEachEntry( vCover, Entry, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 )
                Vec_StrPush( vStr, '0' );
            else if ( Literal == 2 )
                Vec_StrPush( vStr, '1' );
            else if ( Literal == 0 )
                Vec_StrPush( vStr, '-' );
            else
                assert( 0 );
        }
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
    }
    Vec_StrPush( vStr, '\0' );
    return Vec_StrArray( vStr );
}